

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcList.c
# Opt level: O2

void Mvc_CoverAddCubeTail_(Mvc_Cover_t *pCover,Mvc_Cube_t *pCube)

{
  int *piVar1;
  Mvc_Cube_t *pMVar2;
  
  if ((pCover->lCubes).pHead == (Mvc_Cube_t *)0x0) {
    pMVar2 = (Mvc_Cube_t *)&pCover->lCubes;
  }
  else {
    pMVar2 = (pCover->lCubes).pTail;
  }
  pMVar2->pNext = pCube;
  (pCover->lCubes).pTail = pCube;
  pCube->pNext = (Mvc_Cube_t *)0x0;
  piVar1 = &(pCover->lCubes).nItems;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void Mvc_CoverAddCubeTail_( Mvc_Cover_t * pCover, Mvc_Cube_t * pCube )
{
    Mvc_List_t * pList = &pCover->lCubes;

    if ( pList->pHead == NULL )
        pList->pHead = pCube;
    else
        Mvc_CubeSetNext( pList->pTail, pCube );
    pList->pTail    = pCube;
    Mvc_CubeSetNext( pCube, NULL );
    pList->nItems++;
}